

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterCommon.h
# Opt level: O0

int __thiscall PixelToaster::DisplayAdapter::open(DisplayAdapter *this,char *__file,int __oflag,...)

{
  int in_ECX;
  Enumeration in_R8D;
  Enumeration in_R9D;
  int height_local;
  int width_local;
  char *title_local;
  DisplayAdapter *this_local;
  Mode mode_local;
  Output output_local;
  
  (*(this->super_DisplayInterface)._vptr_DisplayInterface[3])();
  magical_strcpy<256>(&this->_title,__file);
  this->_width = __oflag;
  this->_height = in_ECX;
  (this->_output).enumeration = in_R8D;
  (this->_mode).enumeration = in_R9D;
  this->_open = true;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool open(const char title[], int width, int height, Output output, Mode mode) override
    {
        close();

        magical_strcpy(_title, title);
        _width  = width;
        _height = height;
        _output = output;
        _mode   = mode;
        _open   = true;

        return true;
    }